

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O2

void __thiscall Command_Bad_Test::TestBody(Command_Bad_Test *this)

{
  mock_cp *this_00;
  FunctionMocker<void_(const_pstore::broker::broker_command_&)> *this_01;
  TypedExpectation<void_(const_pstore::broker::broker_command_&)> *this_02;
  allocator local_1aa;
  allocator local_1a9;
  undefined1 local_1a8 [32];
  MatcherBase<const_pstore::broker::broker_command_&> local_188;
  MatcherBase<const_pstore::broker::broker_command_&> local_170;
  string local_158;
  string local_138;
  message_type msg;
  
  std::__cxx11::string::string((string *)&local_138,"bad",&local_1a9);
  std::__cxx11::string::string((string *)&local_158,"command",&local_1aa);
  pstore::broker::broker_command::broker_command((broker_command *)&msg,&local_138,&local_158);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_170,(broker_command *)&msg);
  this_00 = &(this->super_Command).cp_;
  this_01 = &(this->super_Command).cp_.gmock11_unknown_53;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_188,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_170);
  testing::internal::FunctionMocker<void_(const_pstore::broker::broker_command_&)>::With
            ((MockSpec<void_(const_pstore::broker::broker_command_&)> *)local_1a8,this_01,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_188);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_188);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(const_pstore::broker::broker_command_&)>::
            InternalExpectedAt((MockSpec<void_(const_pstore::broker::broker_command_&)> *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                               ,0x6a,"cp ()",
                               "unknown (pstore::broker::broker_command{\"bad\", \"command\"})");
  testing::internal::TypedExpectation<void_(const_pstore::broker::broker_command_&)>::Times
            (this_02,1);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)(local_1a8 + 8));
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_170);
  pstore::broker::broker_command::~broker_command((broker_command *)&msg);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)local_1a8,"bad command",(allocator *)&local_188);
  pstore::brokerface::message_type::message_type(&msg,0,0,1,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  pstore::broker::command_processor::process_command
            (&this_00->super_command_processor,&(this->super_Command).fifo_,&msg);
  return;
}

Assistant:

TEST_F (Command, Bad) {
    EXPECT_CALL (cp (), unknown (pstore::broker::broker_command{"bad", "command"})).Times (1);

    pstore::brokerface::message_type msg{message_id, part_no, num_parts, "bad command"};
    cp ().process_command (fifo (), msg);
}